

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2b_Simd256.c
# Opt level: O1

Hacl_Hash_Blake2b_Simd256_state_t *
Hacl_Hash_Blake2b_Simd256_copy(Hacl_Hash_Blake2b_Simd256_state_t *state)

{
  Lib_IntVector_Intrinsics_vec256 *palVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t *puVar36;
  Lib_IntVector_Intrinsics_vec256 *palVar37;
  Lib_IntVector_Intrinsics_vec256 *palVar38;
  Hacl_Hash_Blake2b_Simd256_state_t *pHVar39;
  undefined1 auVar40 [16];
  
  uVar34 = (state->block_state).fst;
  uVar35 = (state->block_state).snd;
  palVar1 = (state->block_state).thd.snd;
  puVar2 = state->buf;
  uVar3 = state->total_len;
  puVar36 = (uint8_t *)calloc(0x80,1);
  uVar4 = *(undefined8 *)(puVar2 + 8);
  uVar5 = *(undefined8 *)(puVar2 + 0x10);
  uVar6 = *(undefined8 *)(puVar2 + 0x18);
  uVar7 = *(undefined8 *)(puVar2 + 0x20);
  uVar8 = *(undefined8 *)(puVar2 + 0x28);
  uVar9 = *(undefined8 *)(puVar2 + 0x30);
  uVar10 = *(undefined8 *)(puVar2 + 0x38);
  uVar11 = *(undefined8 *)(puVar2 + 0x40);
  uVar12 = *(undefined8 *)(puVar2 + 0x48);
  uVar13 = *(undefined8 *)(puVar2 + 0x50);
  uVar14 = *(undefined8 *)(puVar2 + 0x58);
  uVar15 = *(undefined8 *)(puVar2 + 0x60);
  uVar16 = *(undefined8 *)(puVar2 + 0x68);
  uVar17 = *(undefined8 *)(puVar2 + 0x70);
  uVar18 = *(undefined8 *)(puVar2 + 0x78);
  *(undefined8 *)puVar36 = *(undefined8 *)puVar2;
  *(undefined8 *)(puVar36 + 8) = uVar4;
  *(undefined8 *)(puVar36 + 0x10) = uVar5;
  *(undefined8 *)(puVar36 + 0x18) = uVar6;
  *(undefined8 *)(puVar36 + 0x20) = uVar7;
  *(undefined8 *)(puVar36 + 0x28) = uVar8;
  *(undefined8 *)(puVar36 + 0x30) = uVar9;
  *(undefined8 *)(puVar36 + 0x38) = uVar10;
  *(undefined8 *)(puVar36 + 0x40) = uVar11;
  *(undefined8 *)(puVar36 + 0x48) = uVar12;
  *(undefined8 *)(puVar36 + 0x50) = uVar13;
  *(undefined8 *)(puVar36 + 0x58) = uVar14;
  *(undefined8 *)(puVar36 + 0x60) = uVar15;
  *(undefined8 *)(puVar36 + 0x68) = uVar16;
  *(undefined8 *)(puVar36 + 0x70) = uVar17;
  *(undefined8 *)(puVar36 + 0x78) = uVar18;
  palVar37 = (Lib_IntVector_Intrinsics_vec256 *)aligned_alloc(0x20,0x80);
  auVar40 = ZEXT816(0) << 0x40;
  *palVar37 = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar37[1] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar37[2] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar37[3] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar38 = (Lib_IntVector_Intrinsics_vec256 *)aligned_alloc(0x20,0x80);
  auVar40 = ZEXT816(0) << 0x40;
  palVar38[3] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar38[2] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  palVar38[1] = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  *palVar38 = (Lib_IntVector_Intrinsics_vec256)ZEXT1632(auVar40);
  lVar19 = (*palVar1)[0];
  lVar20 = (*palVar1)[1];
  lVar21 = (*palVar1)[2];
  lVar22 = (*palVar1)[3];
  lVar23 = palVar1[1][0];
  lVar24 = palVar1[1][1];
  lVar25 = palVar1[1][2];
  lVar26 = palVar1[1][3];
  lVar27 = palVar1[2][0];
  lVar28 = palVar1[2][1];
  lVar29 = palVar1[2][2];
  lVar30 = palVar1[2][3];
  lVar31 = palVar1[3][1];
  lVar32 = palVar1[3][2];
  lVar33 = palVar1[3][3];
  palVar38[3][0] = palVar1[3][0];
  palVar38[3][1] = lVar31;
  palVar38[3][2] = lVar32;
  palVar38[3][3] = lVar33;
  palVar38[2][0] = lVar27;
  palVar38[2][1] = lVar28;
  palVar38[2][2] = lVar29;
  palVar38[2][3] = lVar30;
  palVar38[1][0] = lVar23;
  palVar38[1][1] = lVar24;
  palVar38[1][2] = lVar25;
  palVar38[1][3] = lVar26;
  (*palVar38)[0] = lVar19;
  (*palVar38)[1] = lVar20;
  (*palVar38)[2] = lVar21;
  (*palVar38)[3] = lVar22;
  pHVar39 = (Hacl_Hash_Blake2b_Simd256_state_t *)malloc(0x28);
  (pHVar39->block_state).fst = uVar34;
  (pHVar39->block_state).snd = uVar35;
  (pHVar39->block_state).thd.fst = palVar37;
  (pHVar39->block_state).thd.snd = palVar38;
  pHVar39->buf = puVar36;
  pHVar39->total_len = uVar3;
  return pHVar39;
}

Assistant:

Hacl_Hash_Blake2b_Simd256_state_t
*Hacl_Hash_Blake2b_Simd256_copy(Hacl_Hash_Blake2b_Simd256_state_t *state)
{
  Hacl_Hash_Blake2b_Simd256_state_t scrut = *state;
  Hacl_Hash_Blake2b_Simd256_block_state_t block_state0 = scrut.block_state;
  uint8_t *buf0 = scrut.buf;
  uint64_t total_len0 = scrut.total_len;
  uint8_t nn = block_state0.snd;
  uint8_t kk1 = block_state0.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk1, .digest_length = nn };
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(128U, sizeof (uint8_t));
  memcpy(buf, buf0, 128U * sizeof (uint8_t));
  Lib_IntVector_Intrinsics_vec256
  *wv =
    (Lib_IntVector_Intrinsics_vec256 *)KRML_ALIGNED_MALLOC(32,
      sizeof (Lib_IntVector_Intrinsics_vec256) * 4U);
  memset(wv, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec256));
  Lib_IntVector_Intrinsics_vec256
  *b =
    (Lib_IntVector_Intrinsics_vec256 *)KRML_ALIGNED_MALLOC(32,
      sizeof (Lib_IntVector_Intrinsics_vec256) * 4U);
  memset(b, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec256));
  Hacl_Hash_Blake2b_Simd256_block_state_t
  block_state = { .fst = i.key_length, .snd = i.digest_length, .thd = { .fst = wv, .snd = b } };
  Lib_IntVector_Intrinsics_vec256 *src_b = block_state0.thd.snd;
  Lib_IntVector_Intrinsics_vec256 *dst_b = block_state.thd.snd;
  memcpy(dst_b, src_b, 4U * sizeof (Lib_IntVector_Intrinsics_vec256));
  Hacl_Hash_Blake2b_Simd256_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = total_len0 };
  Hacl_Hash_Blake2b_Simd256_state_t
  *p =
    (Hacl_Hash_Blake2b_Simd256_state_t *)KRML_HOST_MALLOC(sizeof (
        Hacl_Hash_Blake2b_Simd256_state_t
      ));
  p[0U] = s;
  return p;
}